

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O1

void __thiscall
protozero::
iterator_range<protozero::const_varint_iterator<int>,_std::pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>_>
::drop_front(iterator_range<protozero::const_varint_iterator<int>,_std::pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>_>
             *this)

{
  assert_error *this_00;
  
  if (((this->
       super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>).
       first.m_data ==
       (this->
       super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>).
       second.m_data) &&
     ((this->
      super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>).
      first.m_end ==
      (this->
      super_pair<protozero::const_varint_iterator<int>,_protozero::const_varint_iterator<int>_>).
      second.m_end)) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"!empty()");
    __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
  }
  const_varint_iterator<int>::operator++((const_varint_iterator<int> *)this);
  return;
}

Assistant:

constexpr iterator begin() const noexcept {
        return this->first;
    }